

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void build_rgb_y_table(j_decompress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  JLONG i;
  JLONG *rgb_y_tab;
  my_cconvert_ptr cconvert;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_RDI + 0x268);
  lVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x1800);
  *(long *)(lVar1 + 0x30) = lVar2;
  for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
    *(long *)(lVar2 + local_20 * 8) = local_20 * 0x4c8b;
    *(long *)(lVar2 + 0x800 + local_20 * 8) = local_20 * 0x9646;
    *(long *)(lVar2 + 0x1000 + local_20 * 8) = local_20 * 0x1d2f + 0x8000;
  }
  return;
}

Assistant:

LOCAL(void)
build_rgb_y_table(j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr)cinfo->cconvert;
  JLONG *rgb_y_tab;
  JLONG i;

  /* Allocate and fill in the conversion tables. */
  cconvert->rgb_y_tab = rgb_y_tab = (JLONG *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (TABLE_SIZE * sizeof(JLONG)));

  for (i = 0; i <= MAXJSAMPLE; i++) {
    rgb_y_tab[i + R_Y_OFF] = FIX(0.29900) * i;
    rgb_y_tab[i + G_Y_OFF] = FIX(0.58700) * i;
    rgb_y_tab[i + B_Y_OFF] = FIX(0.11400) * i + ONE_HALF;
  }
}